

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptPromise.cpp
# Opt level: O3

void __thiscall
Js::JavascriptPromiseReaction::ExtractSnapPromiseReactionInto
          (JavascriptPromiseReaction *this,SnapPromiseReactionInfo *snapPromiseReaction,
          List<unsigned_long,_Memory::HeapAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
          *depOnList,SlabAllocator *alloc)

{
  int iVar1;
  RecyclableObject *pRVar2;
  SlabAllocator *alloc_00;
  
  pRVar2 = (this->handler).ptr;
  if ((pRVar2 != (RecyclableObject *)0x0) &&
     ((this->capabilities).ptr != (JavascriptPromiseCapability *)0x0)) {
    snapPromiseReaction->PromiseReactionId = (TTD_PTR_ID)this;
    snapPromiseReaction->HandlerObjId = (TTD_PTR_ID)pRVar2;
    JsUtil::List<unsigned_long,_Memory::HeapAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
    ::EnsureArray(depOnList,0);
    alloc_00 = (SlabAllocator *)
               (depOnList->super_ReadOnlyList<unsigned_long,_Memory::HeapAllocator,_DefaultComparer>
               ).buffer;
    iVar1 = (depOnList->super_ReadOnlyList<unsigned_long,_Memory::HeapAllocator,_DefaultComparer>).
            count;
    (&alloc_00->m_currPos)[iVar1] = (byte *)snapPromiseReaction->HandlerObjId;
    (depOnList->super_ReadOnlyList<unsigned_long,_Memory::HeapAllocator,_DefaultComparer>).count =
         iVar1 + 1;
    JavascriptPromiseCapability::ExtractSnapPromiseCapabilityInto
              ((this->capabilities).ptr,&snapPromiseReaction->Capabilities,depOnList,alloc_00);
    return;
  }
  TTDAbort_unrecoverable_error("Seems odd, I was not expecting this!!!");
}

Assistant:

void JavascriptPromiseReaction::ExtractSnapPromiseReactionInto(TTD::NSSnapValues::SnapPromiseReactionInfo* snapPromiseReaction, JsUtil::List<TTD_PTR_ID, HeapAllocator>& depOnList, TTD::SlabAllocator& alloc)
    {
        TTDAssert(this->handler != nullptr && this->capabilities != nullptr, "Seems odd, I was not expecting this!!!");

        snapPromiseReaction->PromiseReactionId = TTD_CONVERT_PROMISE_INFO_TO_PTR_ID(this);

        snapPromiseReaction->HandlerObjId = TTD_CONVERT_VAR_TO_PTR_ID(this->handler);
        depOnList.Add(snapPromiseReaction->HandlerObjId);

        this->capabilities->ExtractSnapPromiseCapabilityInto(&snapPromiseReaction->Capabilities, depOnList, alloc);
    }